

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O3

void __thiscall Mems::Mems(Mems *this,int width,int height)

{
  ostream *poVar1;
  
  (this->_mems_mirrors_randomrasterized).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mems_mirrors_randomrasterized).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mems_mirrors_multi).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mems_mirrors_randomrasterized).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_width = width;
  this->_height = height;
  this->max_sample_dis = 18.0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Mems created with width  ",0x19);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->_width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and height ",0xc);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->_height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  . ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  return;
}

Assistant:

Mems::Mems(int width, int height)
  :_width(width),
  _height(height),
  max_sample_dis(18)
  {
    std::cout << "Mems created with width  " <<_width<<" and height "<<_height<< "  . " <<"\n";
    std::cout <<"\n";

  }